

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O1

char ** apprun_adjust_string_array_size(char **array)

{
  ulong uVar1;
  char **ppcVar2;
  char *pcVar3;
  long lVar4;
  size_t __nmemb;
  
  __nmemb = 1;
  if ((array != (char **)0x0) && (*array != (char *)0x0)) {
    uVar1 = 1;
    do {
      ppcVar2 = array + uVar1;
      uVar1 = uVar1 + 1;
    } while (*ppcVar2 != (char *)0x0);
    __nmemb = uVar1 & 0xffffffff;
  }
  ppcVar2 = (char **)calloc(__nmemb,8);
  if ((array != (char **)0x0) && (pcVar3 = *array, pcVar3 != (char *)0x0)) {
    lVar4 = 0;
    do {
      *(char **)((long)ppcVar2 + lVar4) = pcVar3;
      pcVar3 = *(char **)((long)array + lVar4 + 8);
      lVar4 = lVar4 + 8;
    } while (pcVar3 != (char *)0x0);
  }
  free(array);
  return ppcVar2;
}

Assistant:

char **apprun_adjust_string_array_size(char **array) {
    unsigned new_capacity = 1;
    for (char **itr = array; itr != NULL && *itr != NULL; itr++)
        new_capacity++;

    char **new = calloc(new_capacity, sizeof(char *));

    char **orginal_itr = array;
    char **new_itr = new;

    for (; orginal_itr != NULL && *orginal_itr != NULL; orginal_itr++, new_itr++)
        *new_itr = *orginal_itr;

    free(array);
    return new;
}